

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob_detection.cpp
# Opt level: O3

void __thiscall Blob_Detection::BlobInfo::_getLength(BlobInfo *this)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *contourX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *contourY;
  PointBase2D<unsigned_int> *startPoint;
  double dVar1;
  PointBase2D<unsigned_int> local_10;
  
  contourX = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             (this->_contourX).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
  contourY = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             (this->_contourX).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (((contourX != contourY) &&
      (startPoint = (PointBase2D<unsigned_int> *)
                    (this->_contourY).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
      startPoint !=
      (PointBase2D<unsigned_int> *)
      (this->_contourY).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish)) && ((this->_length).found == false)) {
    dVar1 = anon_unknown.dwarf_76d95::getLengthFromCountour(contourX,contourY,startPoint,&local_10);
    (this->_length).value = dVar1;
    (this->_length).found = true;
  }
  return;
}

Assistant:

void BlobInfo::_getLength()
    {
        if( !_contourX.empty() && !_contourY.empty() && !_length.found ) {
            PointBase2D< uint32_t > startPoint;
            PointBase2D< uint32_t > endPoint;
            _length.value = getLengthFromCountour( _contourX, _contourY, startPoint, endPoint );

            _length.found = true;
        }
    }